

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::SummaryTest_max_age_Test::TestBody(SummaryTest_max_age_Test *this)

{
  initializer_list<prometheus::detail::CKMSQuantiles::Quantile> __l;
  allocator_type local_c9;
  _Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  local_c8;
  anon_class_8_1_14a0da86 test_value;
  Summary summary;
  
  detail::CKMSQuantiles::Quantile::Quantile((Quantile *)&test_value,0.99,0.001);
  __l._M_len = 1;
  __l._M_array = (Quantile *)&test_value;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector((vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
            *)&local_c8,__l,&local_c9);
  Summary::Summary(&summary,(Quantiles *)&local_c8,(milliseconds)0x3e8,2);
  std::
  _Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::~_Vector_base(&local_c8);
  Summary::Observe(&summary,8.0);
  test_value.summary = &summary;
  TestBody::anon_class_8_1_14a0da86::operator()(&test_value,8.0);
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x258;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&local_c8);
  TestBody::anon_class_8_1_14a0da86::operator()(&test_value,8.0);
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x258;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&local_c8);
  TestBody::anon_class_8_1_14a0da86::operator()(&test_value,NAN);
  Summary::~Summary(&summary);
  return;
}

Assistant:

TEST(SummaryTest, max_age) {
  Summary summary{Summary::Quantiles{{0.99, 0.001}}, std::chrono::seconds(1),
                  2};
  summary.Observe(8.0);

  const auto test_value = [&summary](double ref) {
    auto metric = summary.Collect();
    auto s = metric.summary;
    ASSERT_EQ(s.quantile.size(), 1U);

    if (std::isnan(ref))
      EXPECT_TRUE(std::isnan(s.quantile.at(0).value));
    else
      EXPECT_DOUBLE_EQ(s.quantile.at(0).value, ref);
  };

  test_value(8.0);
  std::this_thread::sleep_for(std::chrono::milliseconds(600));
  test_value(8.0);
  std::this_thread::sleep_for(std::chrono::milliseconds(600));
  test_value(std::numeric_limits<double>::quiet_NaN());
}